

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.cpp
# Opt level: O0

void __thiscall arguments_t::arguments_t(arguments_t *this,int argc,char **argv)

{
  char *pcVar1;
  char **ppcVar2;
  int iVar3;
  mapped_type *this_00;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  string local_78 [8];
  string value;
  allocator local_41;
  string local_40 [8];
  string key;
  char **local_20;
  char **argv_local;
  int argc_local;
  arguments_t *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->options);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->parameters);
  argv_local._4_4_ = argc + -1;
  local_20 = argv + 1;
  while (0 < argv_local._4_4_) {
    if (**local_20 == '-') {
      pcVar1 = *local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar1,&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      std::__cxx11::string::string(local_78);
      ppcVar2 = local_20 + 1;
      iVar3 = argv_local._4_4_ + -1;
      if (0 < argv_local._4_4_ + -1) {
        pcVar1 = local_20[1];
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,pcVar1,&local_99);
        std::__cxx11::string::operator=(local_78,local_98);
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
        ppcVar2 = local_20 + 2;
        iVar3 = argv_local._4_4_ + -2;
      }
      argv_local._4_4_ = iVar3;
      local_20 = ppcVar2;
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->options,(key_type *)local_40);
      std::__cxx11::string::operator=((string *)this_00,local_78);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_40);
    }
    else {
      pcVar1 = *local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->parameters,(value_type *)local_c0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      argv_local._4_4_ = argv_local._4_4_ + -1;
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

arguments_t::arguments_t(int argc, char** argv) {
    argc--;
    argv++;
    while (argc > 0) {
        if (*argv[0] == '-') {
            std::string key(*argv);
            argc--;
            argv++;
            std::string value;
            if (argc > 0) {
                value = std::string(*argv);
                argc--;
                argv++;
            }
            this->options[key] = value;
        }
        else {
            this->parameters.push_back(*argv);
            argc--;
            argv++;
        }
    }
}